

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O2

Result wabt::GenerateNames(Module *module)

{
  Index *str;
  Import *base;
  Export *__rhs;
  pointer ppGVar1;
  pointer ppFVar2;
  pointer ppFVar3;
  pointer ppTVar4;
  pointer ppMVar5;
  pointer ppEVar6;
  pointer ppDVar7;
  pointer ppEVar8;
  DelegateNop DVar9;
  Index IVar10;
  Result RVar11;
  FuncImport *pFVar12;
  ExceptionImport *pEVar13;
  MemoryImport *pMVar14;
  GlobalImport *pGVar15;
  TableImport *pTVar16;
  Func *pFVar17;
  uint uVar18;
  pointer ppIVar19;
  ulong uVar20;
  char *prefix;
  string *str_00;
  pointer ppEVar21;
  long lVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 auStack_108 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  index_to_name;
  undefined1 local_e0 [8];
  NameGenerator generator;
  string new_name;
  BindingHash *local_38;
  
  local_e0 = (undefined1  [8])&PTR__NameGenerator_013e2f08;
  generator.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(_func_int **)0x0;
  ExprVisitor::ExprVisitor((ExprVisitor *)&generator.module_,(Delegate *)local_e0);
  generator.num_table_imports_ = 0;
  generator.num_memory_imports_ = 0;
  generator.visitor_.expr_iter_stack_.
  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  generator.label_count_ = 0;
  generator.num_func_imports_ = 0;
  new_name.field_2._8_8_ =
       (module->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  generator.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(Delegate)module;
  for (ppIVar19 = (module->imports).
                  super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppIVar19 != (pointer)new_name.field_2._8_8_;
      ppIVar19 = ppIVar19 + 1) {
    base = *ppIVar19;
    switch(base->kind_) {
    case First:
      pFVar12 = cast<wabt::FuncImport,wabt::Import>(base);
      if (pFVar12 != (FuncImport *)0x0) {
        local_38 = (BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x1b0);
        str_00 = &(pFVar12->func).name;
        IVar10 = generator.visitor_.expr_iter_stack_.
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        generator.visitor_.expr_iter_stack_.
        super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT44(generator.visitor_.expr_iter_stack_.
                               super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1,
                               generator.visitor_.expr_iter_stack_.
                               super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
LAB_00d94696:
        if (IVar10 == 0xffffffff) {
          __assert_fail("index != kInvalidIndex",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/generate-names.cc"
                        ,0x148,
                        "Result wabt::(anonymous namespace)::NameGenerator::VisitImport(Import *)");
        }
        std::operator+(&local_128,'$',&base->module_name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_108,&local_128,'.');
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &generator.num_global_imports_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_108,&base->field_name);
        std::__cxx11::string::~string((string *)auStack_108);
        std::__cxx11::string::~string((string *)&local_128);
        anon_unknown_16::NameGenerator::MaybeUseAndBindName
                  (local_38,(char *)generator._112_8_,IVar10,str_00);
        std::__cxx11::string::~string((string *)&generator.num_global_imports_);
      }
      break;
    case Table:
      pTVar16 = cast<wabt::TableImport,wabt::Import>(base);
      if (pTVar16 != (TableImport *)0x0) {
        local_38 = (BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x290);
        str_00 = &(pTVar16->table).name;
        IVar10 = generator.label_count_;
        generator.label_count_ = generator.label_count_ + 1;
        goto LAB_00d94696;
      }
      break;
    case Memory:
      pMVar14 = cast<wabt::MemoryImport,wabt::Import>(base);
      if (pMVar14 != (MemoryImport *)0x0) {
        local_38 = (BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x2c8);
        str_00 = &(pMVar14->memory).name;
        IVar10 = generator.num_func_imports_;
        generator.num_func_imports_ = generator.num_func_imports_ + 1;
        goto LAB_00d94696;
      }
      break;
    case Global:
      pGVar15 = cast<wabt::GlobalImport,wabt::Import>(base);
      if (pGVar15 != (GlobalImport *)0x0) {
        local_38 = (BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x1e8);
        str_00 = &(pGVar15->global).name;
        IVar10 = generator.num_table_imports_;
        generator.num_table_imports_ = generator.num_table_imports_ + 1;
        goto LAB_00d94696;
      }
      break;
    case Except:
      pEVar13 = cast<wabt::ExceptionImport,wabt::Import>(base);
      if (pEVar13 != (ExceptionImport *)0x0) {
        local_38 = (BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x178);
        str_00 = &(pEVar13->except).name;
        IVar10 = generator.num_memory_imports_;
        generator.num_memory_imports_ = generator.num_memory_imports_ + 1;
        goto LAB_00d94696;
      }
    }
  }
  new_name.field_2._8_8_ =
       (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  for (ppEVar21 = (module->exports).
                  super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppEVar21 != (pointer)new_name.field_2._8_8_;
      ppEVar21 = ppEVar21 + 1) {
    __rhs = *ppEVar21;
    switch(__rhs->kind) {
    case First:
      pFVar17 = Module::GetFunc((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                                &__rhs->var);
      if (pFVar17 != (Func *)0x0) {
        IVar10 = Module::GetFuncIndex
                           ((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                            &__rhs->var);
        lVar22 = 0x1b0;
LAB_00d94872:
        DVar9.super_Delegate._vptr_Delegate =
             generator.super_DelegateNop.super_Delegate._vptr_Delegate;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &generator.num_global_imports_,'$',&__rhs->name);
        anon_unknown_16::NameGenerator::MaybeUseAndBindName
                  ((BindingHash *)((long)DVar9.super_Delegate._vptr_Delegate + lVar22),
                   (char *)generator._112_8_,IVar10,&pFVar17->name);
        std::__cxx11::string::~string((string *)&generator.num_global_imports_);
      }
      break;
    case Table:
      pFVar17 = (Func *)Module::GetTable((Module *)
                                         generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                                         &__rhs->var);
      if (pFVar17 != (Func *)0x0) {
        IVar10 = Module::GetTableIndex
                           ((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                            &__rhs->var);
        lVar22 = 0x290;
        goto LAB_00d94872;
      }
      break;
    case Memory:
      pFVar17 = (Func *)Module::GetMemory((Module *)
                                          generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                                          &__rhs->var);
      if (pFVar17 != (Func *)0x0) {
        IVar10 = Module::GetMemoryIndex
                           ((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                            &__rhs->var);
        lVar22 = 0x2c8;
        goto LAB_00d94872;
      }
      break;
    case Global:
      pFVar17 = (Func *)Module::GetGlobal((Module *)
                                          generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                                          &__rhs->var);
      if (pFVar17 != (Func *)0x0) {
        IVar10 = Module::GetGlobalIndex
                           ((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                            &__rhs->var);
        lVar22 = 0x1e8;
        goto LAB_00d94872;
      }
      break;
    case Except:
      pFVar17 = (Func *)Module::GetExcept((Module *)
                                          generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                                          &__rhs->var);
      if (pFVar17 != (Func *)0x0) {
        IVar10 = Module::GetExceptIndex
                           ((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                            &__rhs->var);
        lVar22 = 0x178;
        goto LAB_00d94872;
      }
    }
  }
  uVar18 = 0;
  while( true ) {
    ppGVar1 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->globals).
                      super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3) <= (ulong)uVar18)
    break;
    anon_unknown_16::NameGenerator::MaybeGenerateAndBindName
              ((BindingHash *)
               ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x1e8),"$g",uVar18
               ,&ppGVar1[uVar18]->name);
    uVar18 = uVar18 + 1;
  }
  uVar18 = 0;
  while( true ) {
    ppFVar2 = (module->func_types).
              super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->func_types).
                      super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3) <=
        (ulong)uVar18) break;
    anon_unknown_16::NameGenerator::MaybeGenerateAndBindName
              ((BindingHash *)
               ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 600),"$t",uVar18,
               &ppFVar2[uVar18]->name);
    uVar18 = uVar18 + 1;
  }
  uVar20 = 0;
  str = &generator.num_global_imports_;
  do {
    ppFVar3 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->funcs).
                      super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppFVar3 >> 3) <= uVar20) break;
    pFVar17 = ppFVar3[uVar20];
    anon_unknown_16::NameGenerator::MaybeGenerateAndBindName
              ((BindingHash *)
               ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x1b0),"$f",
               (Index)uVar20,&pFVar17->name);
    auStack_108 = (undefined1  [8])0x0;
    index_to_name.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    index_to_name.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    new_name.field_2._8_8_ = uVar20;
    IVar10 = Func::GetNumParamsAndLocals(pFVar17);
    MakeTypeBindingReverseMapping
              ((ulong)IVar10,&pFVar17->bindings,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)auStack_108);
    lVar22 = 0;
    for (uVar20 = 0;
        uVar20 < (ulong)((long)index_to_name.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)auStack_108 >> 5);
        uVar20 = uVar20 + 1) {
      if (*(long *)((long)auStack_108 + lVar22 + 8) == 0) {
        prefix = "$p";
        if (((ulong)((long)(pFVar17->decl).sig.param_types.
                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pFVar17->decl).sig.param_types.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2 & 0xffffffff) <= uVar20) {
          prefix = "$l";
        }
        generator._112_8_ = &new_name._M_string_length;
        new_name._M_dataplus._M_p = (pointer)0x0;
        new_name._M_string_length._0_1_ = 0;
        anon_unknown_16::NameGenerator::GenerateAndBindName
                  (&pFVar17->bindings,prefix,(Index)uVar20,(string *)str);
        std::__cxx11::string::_M_assign((string *)((long)auStack_108 + lVar22),(string *)str);
        std::__cxx11::string::~string((string *)str);
      }
      lVar22 = lVar22 + 0x20;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_108);
    generator.visitor_.expr_iter_stack_.
    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)generator.visitor_.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
    RVar11 = ExprVisitor::VisitFunc((ExprVisitor *)&generator.module_,pFVar17);
    uVar20 = (ulong)((int)new_name.field_2._8_8_ + 1);
  } while (RVar11.enum_ != Error);
  uVar18 = 0;
  while( true ) {
    ppTVar4 = (module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->tables).
                      super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppTVar4 >> 3) <= (ulong)uVar18)
    break;
    anon_unknown_16::NameGenerator::MaybeGenerateAndBindName
              ((BindingHash *)
               ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x290),"$T",uVar18
               ,&ppTVar4[uVar18]->name);
    uVar18 = uVar18 + 1;
  }
  uVar18 = 0;
  while( true ) {
    ppMVar5 = (module->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->memories).
                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppMVar5 >> 3) <= (ulong)uVar18)
    break;
    anon_unknown_16::NameGenerator::MaybeGenerateAndBindName
              ((BindingHash *)
               ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x2c8),"$M",uVar18
               ,&ppMVar5[uVar18]->name);
    uVar18 = uVar18 + 1;
  }
  uVar18 = 0;
  while( true ) {
    ppEVar6 = (module->excepts).
              super__Vector_base<wabt::Exception_*,_std::allocator<wabt::Exception_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->excepts).
                      super__Vector_base<wabt::Exception_*,_std::allocator<wabt::Exception_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar6 >> 3) <=
        (ulong)uVar18) break;
    anon_unknown_16::NameGenerator::MaybeGenerateAndBindName
              ((BindingHash *)
               ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x178),"$e",uVar18
               ,&ppEVar6[uVar18]->name);
    uVar18 = uVar18 + 1;
  }
  uVar18 = 0;
  while( true ) {
    ppDVar7 = (module->data_segments).
              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->data_segments).
                      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppDVar7 >> 3) <=
        (ulong)uVar18) break;
    anon_unknown_16::NameGenerator::MaybeGenerateAndBindName
              ((BindingHash *)
               ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x300),"$d",uVar18
               ,&ppDVar7[uVar18]->name);
    uVar18 = uVar18 + 1;
  }
  uVar18 = 0;
  while( true ) {
    ppEVar8 = (module->elem_segments).
              super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->elem_segments).
                      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar8 >> 3) <=
        (ulong)uVar18) break;
    anon_unknown_16::NameGenerator::MaybeGenerateAndBindName
              ((BindingHash *)
               ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x338),"$e",uVar18
               ,&ppEVar8[uVar18]->name);
    uVar18 = uVar18 + 1;
  }
  generator.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(_func_int **)0x0;
  anon_unknown_16::NameGenerator::~NameGenerator((NameGenerator *)local_e0);
  return (Result)Ok;
}

Assistant:

Result GenerateNames(Module* module) {
  NameGenerator generator;
  return generator.VisitModule(module);
}